

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_deserialize_container
          (t_lua_generator *this,ostream *out,t_type *ttype,bool local,string *prefix)

{
  t_type *ptVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  undefined1 local_480 [8];
  t_field fetype;
  undefined1 local_3b0 [8];
  t_field fvtype;
  undefined1 local_2e0 [8];
  t_field fktype;
  undefined1 local_210 [8];
  t_field fsize;
  string local_158;
  undefined1 local_138 [8];
  string etype;
  string local_110;
  undefined1 local_f0 [8];
  string vtype;
  string local_c8;
  undefined1 local_a8 [8];
  string ktype;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  string size;
  string *prefix_local;
  bool local_local;
  t_type *ttype_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  size.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"_size",&local_71);
  t_generator::tmp((string *)local_50,(t_generator *)this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_c8,"_ktype",(allocator *)(vtype.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_a8,(t_generator *)this,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(vtype.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_110,"_vtype",(allocator *)(etype.field_2._M_local_buf + 0xf));
  t_generator::tmp((string *)local_f0,(t_generator *)this,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator((allocator<char> *)(etype.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_158,"_etype",(allocator *)&fsize.field_0xaf);
  t_generator::tmp((string *)local_138,(t_generator *)this,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator((allocator<char> *)&fsize.field_0xaf);
  ptVar1 = g_type_i32;
  std::__cxx11::string::string((string *)&fktype.reference_,(string *)local_50);
  t_field::t_field((t_field *)local_210,ptVar1,(string *)&fktype.reference_);
  std::__cxx11::string::~string((string *)&fktype.reference_);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&fvtype.reference_,(string *)local_a8);
  t_field::t_field((t_field *)local_2e0,ptVar1,(string *)&fvtype.reference_);
  std::__cxx11::string::~string((string *)&fvtype.reference_);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&fetype.reference_,(string *)local_f0);
  t_field::t_field((t_field *)local_3b0,ptVar1,(string *)&fetype.reference_);
  std::__cxx11::string::~string((string *)&fetype.reference_);
  ptVar1 = g_type_i8;
  std::__cxx11::string::string((string *)&local_4a0,(string *)local_138);
  t_field::t_field((t_field *)local_480,ptVar1,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  poVar3 = t_generator::indent((t_generator *)this,out);
  pcVar4 = "";
  if (local) {
    pcVar4 = "local ";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  poVar3 = std::operator<<(poVar3,(string *)prefix);
  poVar3 = std::operator<<(poVar3," = {}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"local ");
        poVar3 = std::operator<<(poVar3,(string *)local_138);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::operator<<(poVar3,(string *)local_50);
        poVar3 = std::operator<<(poVar3," = iprot:readListBegin()");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"local ");
      poVar3 = std::operator<<(poVar3,(string *)local_138);
      poVar3 = std::operator<<(poVar3,", ");
      poVar3 = std::operator<<(poVar3,(string *)local_50);
      poVar3 = std::operator<<(poVar3," = iprot:readSetBegin()");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"local ");
    poVar3 = std::operator<<(poVar3,(string *)local_a8);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)local_f0);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::operator<<(poVar3,(string *)local_50);
    poVar3 = std::operator<<(poVar3," = iprot:readMapBegin() ");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"for _i=1,");
  poVar3 = std::operator<<(poVar3,(string *)local_50);
  poVar3 = std::operator<<(poVar3," do");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        std::__cxx11::string::string((string *)&local_500,(string *)prefix);
        generate_deserialize_list_element(this,out,(t_list *)ttype,&local_500);
        std::__cxx11::string::~string((string *)&local_500);
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_4e0,(string *)prefix);
      generate_deserialize_set_element(this,out,(t_set *)ttype,&local_4e0);
      std::__cxx11::string::~string((string *)&local_4e0);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_4c0,(string *)prefix);
    generate_deserialize_map_element(this,out,(t_map *)ttype,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"end");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])();
  if ((uVar2 & 1) == 0) {
    uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])();
      if ((uVar2 & 1) != 0) {
        poVar3 = t_generator::indent((t_generator *)this,out);
        poVar3 = std::operator<<(poVar3,"iprot:readListEnd()");
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      }
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      poVar3 = std::operator<<(poVar3,"iprot:readSetEnd()");
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"iprot:readMapEnd()");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_field::~t_field((t_field *)local_480);
  t_field::~t_field((t_field *)local_3b0);
  t_field::~t_field((t_field *)local_2e0);
  t_field::~t_field((t_field *)local_210);
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_container(ostream& out,
                                                     t_type* ttype,
                                                     bool local,
                                                     string prefix) {
  string size = tmp("_size");
  string ktype = tmp("_ktype");
  string vtype = tmp("_vtype");
  string etype = tmp("_etype");

  t_field fsize(g_type_i32, size);
  t_field fktype(g_type_i8, ktype);
  t_field fvtype(g_type_i8, vtype);
  t_field fetype(g_type_i8, etype);

  // Declare variables, read header
  indent(out) << (local ? "local " : "") << prefix << " = {}" << endl;
  if (ttype->is_map()) {
    indent(out) << "local " << ktype << ", " << vtype << ", " << size << " = iprot:readMapBegin() "
                << endl;
  } else if (ttype->is_set()) {
    indent(out) << "local " << etype << ", " << size << " = iprot:readSetBegin()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "local " << etype << ", " << size << " = iprot:readListBegin()" << endl;
  }

  // Deserialize
  indent(out) << "for _i=1," << size << " do" << endl;
  indent_up();

  if (ttype->is_map()) {
    generate_deserialize_map_element(out, (t_map*)ttype, prefix);
  } else if (ttype->is_set()) {
    generate_deserialize_set_element(out, (t_set*)ttype, prefix);
  } else if (ttype->is_list()) {
    generate_deserialize_list_element(out, (t_list*)ttype, prefix);
  }

  indent_down();
  indent(out) << "end" << endl;

  // Read container end
  if (ttype->is_map()) {
    indent(out) << "iprot:readMapEnd()" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "iprot:readSetEnd()" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "iprot:readListEnd()" << endl;
  }
}